

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveRemoveWindowsCb(Walker *pWalker,Expr *pExpr)

{
  Window *pWVar1;
  Window *pWVar2;
  Window **ppWVar3;
  
  if ((pExpr->flags & 0x1000000) != 0) {
    pWVar2 = ((pWalker->u).pSelect)->pWin;
    if (pWVar2 != (Window *)0x0) {
      if (pWVar2 == (Window *)(pExpr->y).pTab) {
        ppWVar3 = &((pWalker->u).pSelect)->pWin;
      }
      else {
        do {
          pWVar1 = pWVar2;
          pWVar2 = pWVar1->pNextWin;
          if (pWVar2 == (Window *)0x0) {
            return 0;
          }
        } while (pWVar2 != (Window *)(pExpr->y).pTab);
        ppWVar3 = &pWVar1->pNextWin;
      }
      *ppWVar3 = pWVar2->pNextWin;
    }
  }
  return 0;
}

Assistant:

static int resolveRemoveWindowsCb(Walker *pWalker, Expr *pExpr){
  if( ExprHasProperty(pExpr, EP_WinFunc) ){
    Window **pp;
    for(pp=&pWalker->u.pSelect->pWin; *pp; pp=&(*pp)->pNextWin){
      if( *pp==pExpr->y.pWin ){
        *pp = (*pp)->pNextWin;
        break;
      }    
    }
  }
  return WRC_Continue;
}